

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

void re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  uint uVar1;
  Regexp *this;
  Regexp *this_00;
  int iVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  Regexp *pRVar4;
  Regexp *this_01;
  int iVar5;
  int iVar6;
  ulong uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  LogMessage local_1b0;
  
  this = *r1ptr;
  paVar8 = &this->field_5;
  paVar3 = paVar8;
  if (1 < this->nsub_) {
    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_00 = *r2ptr;
  pRVar4 = Regexp::Incref(paVar3->subone_);
  pRVar4 = Regexp::Repeat(pRVar4,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    *(int *)&pRVar4->field_7 = -1;
    *(int *)((long)&pRVar4->field_7 + 4) = 0;
    iVar5 = 0;
    goto LAB_00114df0;
  case '\b':
    *(int *)&pRVar4->field_7 = -1;
    *(int *)((long)&pRVar4->field_7 + 4) = 1;
    iVar5 = 1;
LAB_00114df0:
    iVar2 = -1;
    break;
  case '\t':
    *(int *)&pRVar4->field_7 = 1;
    *(int *)((long)&pRVar4->field_7 + 4) = 0;
    iVar5 = 0;
    iVar2 = 1;
    break;
  case '\n':
    iVar5 = (this->field_7).field_0.min_;
    (pRVar4->field_7).field_0.min_ = iVar5;
    if (this->op_ != '\n') goto LAB_00114ff0;
    iVar2 = (this->field_7).field_0.max_;
    (pRVar4->field_7).field_0.max_ = iVar2;
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x167,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"DoCoalesce failed: r1->op() is ",0x1f);
    std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)this->op_);
    goto LAB_00114fcc;
  }
  switch(this_00->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    (pRVar4->field_7).field_0.min_ = iVar5 + 1;
  case '\t':
    if (pRVar4->op_ != '\n') {
LAB_00114ff0:
      __assert_fail("(op_) == (kRegexpRepeat)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x148,"int re2::Regexp::max()");
    }
    if (iVar2 != -1) {
      iVar2 = iVar2 + 1;
LAB_00114e2e:
      (pRVar4->field_7).field_0.max_ = iVar2;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar8->subone_->op_ != '\x03') {
      __assert_fail("(op_) == (kRegexpLiteral)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x149,"Rune re2::Regexp::rune()");
    }
    uVar1 = (this_00->field_7).field_0.max_;
    uVar7 = 1;
    if (1 < (int)uVar1) {
      uVar7 = 1;
      do {
        if (*(int *)((long)&(((this_00->field_7).field_1.name_)->_M_dataplus)._M_p + uVar7 * 4) !=
            (paVar8->subone_->field_7).field_0.max_) goto LAB_00114f3a;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar7 = (ulong)uVar1;
    }
LAB_00114f3a:
    iVar6 = (int)uVar7;
    (pRVar4->field_7).field_0.min_ = iVar5 + iVar6;
    if (pRVar4->op_ != '\n') goto LAB_00114ff0;
    if (iVar2 != -1) {
      (pRVar4->field_7).field_0.max_ = iVar2 + iVar6;
    }
    if (this_00->op_ != '\x04') {
      __assert_fail("(op_) == (kRegexpLiteralString)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x14e,"int re2::Regexp::nrunes()");
    }
    if (iVar6 != (this_00->field_7).field_0.max_) {
      *r1ptr = pRVar4;
      pRVar4 = Regexp::LiteralString
                         ((Rune *)((long)&(((this_00->field_7).field_1.name_)->_M_dataplus)._M_p +
                                  (uVar7 & 0xffffffff) * 4),(this_00->field_7).field_0.max_ - iVar6,
                          (uint)this_00->parse_flags_);
      goto LAB_00114ed2;
    }
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x1a4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"DoCoalesce failed: r2->op() is ",0x1f);
    std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)this_00->op_);
LAB_00114fcc:
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    Regexp::Decref(pRVar4);
    return;
  case '\b':
    (pRVar4->field_7).field_0.min_ = iVar5 + 1;
  case '\a':
switchD_00114e13_caseD_7:
    (pRVar4->field_7).field_0.max_ = -1;
    break;
  case '\n':
    (pRVar4->field_7).field_0.min_ = iVar5 + (this_00->field_7).field_0.min_;
    if (this_00->op_ != '\n') goto LAB_00114ff0;
    iVar5 = (this_00->field_7).field_0.max_;
    if (iVar5 == -1) goto switchD_00114e13_caseD_7;
    if (pRVar4->op_ != '\n') goto LAB_00114ff0;
    if (iVar2 == -1) break;
    iVar2 = iVar2 + iVar5;
    goto LAB_00114e2e;
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_01,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_01;
LAB_00114ed2:
  *r2ptr = pRVar4;
  Regexp::Decref(this);
  Regexp::Decref(this_00);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->min_ = 0;
      nre->max_ = -1;
      break;

    case kRegexpPlus:
      nre->min_ = 1;
      nre->max_ = -1;
      break;

    case kRegexpQuest:
      nre->min_ = 0;
      nre->max_ = 1;
      break;

    case kRegexpRepeat:
      nre->min_ = r1->min();
      nre->max_ = r1->max();
      break;

    default:
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      nre->Decref();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->min_++;
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->min_ += r2->min();
      if (r2->max() == -1)
        nre->max_ = -1;
      else if (nre->max() != -1)
        nre->max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->min_++;
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->min_ += n;
      if (nre->max() != -1)
        nre->max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      nre->Decref();
      return;
  }

  r1->Decref();
  r2->Decref();
}